

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O3

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneBspTreeIndex::items
          (QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsSceneBspTreeIndex *this,
          SortOrder order)

{
  QGraphicsSceneBspTreeIndexPrivate *this_00;
  const_iterator cVar1;
  long in_FS_OFFSET;
  QGraphicsItem *null;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsSceneBspTreeIndexPrivate **)(this + 8);
  QGraphicsSceneBspTreeIndexPrivate::purgeRemovedItems(this_00);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QGraphicsItem **)0x0;
  QList<QGraphicsItem_*>::reserve
            (__return_storage_ptr__,
             (this_00->unindexedItems).d.size + (this_00->indexedItems).d.size);
  local_38 = 0;
  cVar1.i = (this_00->indexedItems).d.ptr;
  std::
  __remove_copy_if<QList<QGraphicsItem*>::const_iterator,std::back_insert_iterator<QList<QGraphicsItem*>>,__gnu_cxx::__ops::_Iter_equals_val<QGraphicsItem*const>>
            (cVar1,(const_iterator)(cVar1.i + (this_00->indexedItems).d.size),
             (back_insert_iterator<QList<QGraphicsItem_*>_>)__return_storage_ptr__,
             (_Iter_equals_val<QGraphicsItem_*const>)&local_38);
  cVar1.i = (this_00->unindexedItems).d.ptr;
  std::
  __remove_copy_if<QList<QGraphicsItem*>::const_iterator,std::back_insert_iterator<QList<QGraphicsItem*>>,__gnu_cxx::__ops::_Iter_equals_val<QGraphicsItem*const>>
            (cVar1,(const_iterator)(cVar1.i + (this_00->unindexedItems).d.size),
             (back_insert_iterator<QList<QGraphicsItem_*>_>)__return_storage_ptr__,
             (_Iter_equals_val<QGraphicsItem_*const>)&local_38);
  QGraphicsSceneBspTreeIndexPrivate::sortItems
            (__return_storage_ptr__,order,this_00->sortCacheEnabled,false);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneBspTreeIndex::items(Qt::SortOrder order) const
{
    Q_D(const QGraphicsSceneBspTreeIndex);
    const_cast<QGraphicsSceneBspTreeIndexPrivate*>(d)->purgeRemovedItems();
    QList<QGraphicsItem *> itemList;
    itemList.reserve(d->indexedItems.size() + d->unindexedItems.size());

    // Rebuild the list of items to avoid holes. ### We could also just
    // compress the item lists at this point.
    QGraphicsItem *null = nullptr; // work-around for (at least) MSVC 2012 emitting
                                   // warning C4100 for its own header <algorithm>
                                   // when passing nullptr directly to remove_copy:
    std::remove_copy(d->indexedItems.cbegin(), d->indexedItems.cend(),
                     std::back_inserter(itemList), null);
    std::remove_copy(d->unindexedItems.cbegin(), d->unindexedItems.cend(),
                     std::back_inserter(itemList), null);

    d->sortItems(&itemList, order, d->sortCacheEnabled);
    return itemList;
}